

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

vectorTy * __thiscall
DataRefs::GetSimWind(vectorTy *__return_storage_ptr__,DataRefs *this,double alt_m)

{
  pointer pWVar1;
  pointer pWVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  pointer pWVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  pWVar1 = (this->lastWind).
           super__Vector_base<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>._M_impl
           .super__Vector_impl_data._M_start;
  pWVar2 = (this->lastWind).
           super__Vector_base<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pWVar1 == pWVar2) {
    dVar9 = 0.0;
    dVar8 = 0.0;
    goto LAB_00129479;
  }
  lVar4 = (long)pWVar2 - (long)pWVar1;
  if ((NAN(alt_m) || lVar4 == 0x18) || (alt_m <= pWVar1->alt_m)) {
LAB_00129474:
    dVar9 = pWVar1->spd_msc;
    dVar8 = pWVar1->dir_degt;
  }
  else {
    lVar6 = 0x48;
    lVar5 = 0;
    for (lVar3 = lVar4 / 0x18 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
      dVar8 = *(double *)((long)&pWVar1[-3].alt_m + lVar6);
      if (alt_m <= dVar8) {
        pWVar7 = (pointer)((long)pWVar1 - lVar5);
        goto LAB_001293fa;
      }
      dVar8 = *(double *)((long)&pWVar1[-2].alt_m + lVar6);
      if (alt_m <= dVar8) {
        pWVar7 = (pointer)((long)pWVar1 + (0x18 - lVar5));
        goto LAB_001293fa;
      }
      dVar8 = *(double *)((long)&pWVar1[-1].alt_m + lVar6);
      if (alt_m <= dVar8) {
        pWVar7 = (pointer)((long)pWVar1 + (0x30 - lVar5));
        goto LAB_001293fa;
      }
      dVar8 = *(double *)((long)&pWVar1->alt_m + lVar6);
      if (alt_m <= dVar8) {
        pWVar7 = (pointer)((long)pWVar1 + (0x48 - lVar5));
        goto LAB_001293fa;
      }
      lVar5 = lVar5 + -0x60;
      lVar6 = lVar6 + 0x60;
    }
    lVar4 = (lVar4 + lVar5) / 0x18;
    pWVar7 = (pointer)((long)pWVar1 - lVar5);
    if (lVar4 == 1) {
LAB_001294c6:
      dVar8 = pWVar7->alt_m;
      if (alt_m <= dVar8) goto LAB_001293fa;
    }
    else {
      if (lVar4 == 3) {
        dVar8 = *(double *)((long)&pWVar1[-3].alt_m + lVar6);
        if (dVar8 < alt_m) {
          pWVar7 = (pointer)((long)pWVar1 + (0x18 - lVar5));
          goto LAB_001294b3;
        }
      }
      else {
        if (lVar4 != 2) goto LAB_001294d5;
LAB_001294b3:
        dVar8 = pWVar7->alt_m;
        if (dVar8 < alt_m) {
          pWVar7 = pWVar7 + 1;
          goto LAB_001294c6;
        }
      }
LAB_001293fa:
      if (pWVar7 != pWVar2) {
        if (pWVar7 != pWVar1) {
          dVar10 = (alt_m - pWVar7[-1].alt_m) / (dVar8 - pWVar7[-1].alt_m);
          dVar9 = (1.0 - dVar10) * pWVar7[-1].spd_msc + pWVar7->spd_msc * dVar10;
          dVar8 = HeadingDiff(pWVar7[-1].dir_degt,pWVar7->dir_degt);
          dVar8 = HeadingNormalize(dVar8 * dVar10 + pWVar7[-1].dir_degt);
          goto LAB_00129479;
        }
        goto LAB_00129474;
      }
    }
LAB_001294d5:
    dVar9 = pWVar2[-1].spd_msc;
    dVar8 = pWVar2[-1].dir_degt;
  }
LAB_00129479:
  __return_storage_ptr__->angle = dVar8;
  __return_storage_ptr__->dist = NAN;
  __return_storage_ptr__->vsi = NAN;
  __return_storage_ptr__->speed = dVar9;
  return __return_storage_ptr__;
}

Assistant:

const vectorTy DataRefs::GetSimWind (double alt_m) const
{
    // No wind layers known? -> return "no wind"
    if (lastWind.empty())
        return vectorTy(0.0, NAN, NAN, 0.0);
    // Just one wind layer? Or plane is lower than first layer? -> return first layer's wind
    if (lastWind.size() == 1 || std::isnan(alt_m) || alt_m <= lastWind[0].alt_m)
        return vectorTy(lastWind.front().dir_degt, NAN, NAN, lastWind.front().spd_msc);
    // More than one layer and plane is flying higher than first layer
    // Find the fist layer, which is higher than the plane
    auto iter = std::find_if(lastWind.cbegin(), lastWind.cend(),
                             [alt_m](const WindLayerTy& wl){ return alt_m <= wl.alt_m; });
    // If not found, then plane is flying higher than highest layer -> return highest wind
    if (iter == lastWind.cend())
        return vectorTy(lastWind.back().dir_degt, NAN, NAN, lastWind.back().spd_msc);
    // else we found a higher wind layer, but is it right away the first?
    // (should not happen...but just to be on the safe side we catch the case)
    if (iter == lastWind.cbegin())
        return vectorTy(lastWind.front().dir_degt, NAN, NAN, lastWind.front().spd_msc);
    // Now really...plane is in the middle between two layers
    // return an average value between them
    const WindLayerTy& low = *std::prev(iter);
    const WindLayerTy& hgh = *iter;
    const double f = (alt_m - low.alt_m) / (hgh.alt_m - low.alt_m);     // factor how much to use the higher value, should be between 0 and 1
    const double spd = (1.0-f) * low.spd_msc + f * hgh.spd_msc;         // average of speed
    const double hdg_diff = HeadingDiff(low.dir_degt, hgh.dir_degt);    // heading diff
    const double hdg = low.dir_degt + f*hdg_diff;                       // "average" of heading
    return vectorTy(HeadingNormalize(hdg), NAN, NAN, spd);
}